

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t archive_read_format_cab_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  long lVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  uint uVar9;
  uchar *p;
  archive_string_conv *sc;
  int *piVar10;
  wchar_t *pwVar11;
  size_t n;
  void *pvVar12;
  ssize_t sVar13;
  uint *puVar14;
  time_t tVar15;
  uchar *p_00;
  size_t sVar16;
  ushort uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  uint uVar21;
  char *pcVar22;
  uchar *p_1;
  char *p_01;
  mode_t m;
  int iVar23;
  long lVar24;
  ushort uVar25;
  uint uVar26;
  uint *puVar27;
  ulong uVar28;
  long local_70;
  tm local_68;
  
  puVar4 = (undefined8 *)a->format->data;
  wVar7 = L'\0';
  if (*(char *)(puVar4 + 0x12) == '\0') {
    (a->archive).archive_format = 0xc0000;
    if ((a->archive).archive_format_name == (char *)0x0) {
      (a->archive).archive_format_name = "CAB";
    }
    pcVar22 = (char *)__archive_read_ahead(a,0x2a,(ssize_t *)0x0);
    if (pcVar22 == (char *)0x0) goto LAB_0014adea;
    pvVar5 = a->format->data;
    if (((*(char *)((long)pvVar5 + 0x90) == '\0') && (*pcVar22 == 'M')) && (pcVar22[1] == 'Z')) {
      uVar28 = 0x1000;
      do {
        while (pcVar22 = (char *)__archive_read_ahead(a,uVar28,(ssize_t *)&local_68),
              pcVar22 != (char *)0x0) {
          lVar24 = CONCAT44(local_68.tm_min,local_68.tm_sec);
          for (p_01 = pcVar22; p_01 + 8 < pcVar22 + lVar24; p_01 = p_01 + (uint)wVar7) {
            wVar7 = find_cab_magic(p_01);
            if (wVar7 == L'\0') {
              __archive_read_consume(a,(long)p_01 - (long)pcVar22);
              pcVar22 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
              if (pcVar22 == (char *)0x0) goto LAB_0014adea;
              goto LAB_0014aadb;
            }
          }
          __archive_read_consume(a,(long)p_01 - (long)pcVar22);
        }
        bVar20 = 0xff < uVar28;
        uVar28 = uVar28 >> 1;
      } while (bVar20);
    }
    else {
LAB_0014aadb:
      *(undefined8 *)((long)pvVar5 + 0x40) = 0;
      if (((*pcVar22 == 'M') && (pcVar22[1] == 'S')) && ((pcVar22[2] == 'C' && (pcVar22[3] == 'F')))
         ) {
        *(undefined4 *)((long)pvVar5 + 0x48) = *(undefined4 *)(pcVar22 + 8);
        *(undefined4 *)((long)pvVar5 + 0x4c) = *(undefined4 *)(pcVar22 + 0x10);
        *(char *)((long)pvVar5 + 0x5b) = pcVar22[0x18];
        *(char *)((long)pvVar5 + 0x5a) = pcVar22[0x19];
        sVar2 = *(short *)(pcVar22 + 0x1a);
        *(short *)((long)pvVar5 + 0x50) = sVar2;
        if ((sVar2 != 0) &&
           (sVar2 = *(short *)(pcVar22 + 0x1c), *(short *)((long)pvVar5 + 0x52) = sVar2, sVar2 != 0)
           ) {
          uVar17 = *(ushort *)(pcVar22 + 0x1e);
          *(ushort *)((long)pvVar5 + 0x54) = uVar17;
          *(undefined2 *)((long)pvVar5 + 0x56) = *(undefined2 *)(pcVar22 + 0x20);
          *(undefined2 *)((long)pvVar5 + 0x58) = *(undefined2 *)(pcVar22 + 0x22);
          if ((uVar17 & 4) == 0) {
            *(undefined1 *)((long)pvVar5 + 0x5c) = 0;
            lVar24 = 0x24;
          }
          else {
            uVar25 = *(ushort *)(pcVar22 + 0x24);
            if (60000 < (ulong)uVar25) goto LAB_0014b0aa;
            *(char *)((long)pvVar5 + 0x5c) = pcVar22[0x26];
            *(char *)((long)pvVar5 + 0x5d) = pcVar22[0x27];
            lVar24 = (ulong)uVar25 + 0x28;
          }
          if ((uVar17 & 1) == 0) {
LAB_0014aba7:
            if ((uVar17 & 2) == 0) {
LAB_0014abb3:
              __archive_read_consume(a,lVar24);
              *(long *)((long)pvVar5 + 0x40) = *(long *)((long)pvVar5 + 0x40) + lVar24;
              uVar17 = *(ushort *)((long)pvVar5 + 0x50);
              pvVar12 = calloc((ulong)uVar17,0x60);
              *(void **)((long)pvVar5 + 0x60) = pvVar12;
              if (pvVar12 != (void *)0x0) {
                if ((*(byte *)((long)pvVar5 + 0x54) & 4) == 0) {
                  lVar24 = 8;
                }
                else {
                  lVar24 = (ulong)*(byte *)((long)pvVar5 + 0x5c) + 8;
                }
                puVar14 = (uint *)__archive_read_ahead(a,lVar24 * (ulong)uVar17,(ssize_t *)0x0);
                if (puVar14 == (uint *)0x0) {
LAB_0014adea:
                  truncated_error(a);
                  return L'\xffffffe2';
                }
                uVar17 = *(ushort *)((long)pvVar5 + 0x50);
                lVar18 = 0;
                uVar9 = 0;
                for (lVar24 = 0; (ulong)uVar17 * 0x60 - lVar24 != 0; lVar24 = lVar24 + 0x60) {
                  lVar6 = *(long *)((long)pvVar5 + 0x60);
                  uVar3 = *puVar14;
                  *(uint *)(lVar6 + lVar24) = uVar3;
                  *(short *)(lVar6 + 4 + lVar24) = (short)puVar14[1];
                  uVar26 = *(ushort *)((long)puVar14 + 6) & 0xf;
                  uVar25 = (ushort)uVar26;
                  *(ushort *)(lVar6 + 6 + lVar24) = uVar25;
                  *(ushort *)(lVar6 + 8 + lVar24) = (ushort)*(byte *)((long)puVar14 + 7);
                  pcVar22 = "UNKNOWN";
                  if (uVar25 < 4) {
                    pcVar22 = compression_name_rel +
                              *(int *)(compression_name_rel + (ulong)uVar26 * 4);
                  }
                  *(char **)(lVar6 + 0x10 + lVar24) = pcVar22;
                  puVar14 = puVar14 + 2;
                  lVar18 = lVar18 + 8;
                  if ((*(byte *)((long)pvVar5 + 0x54) & 4) != 0) {
                    puVar14 = (uint *)((long)puVar14 + (ulong)*(byte *)((long)pvVar5 + 0x5c));
                    lVar18 = lVar18 + (ulong)*(byte *)((long)pvVar5 + 0x5c);
                  }
                  if (uVar3 <= uVar9) goto LAB_0014b0aa;
                  *(undefined1 *)(lVar6 + 0x5c + lVar24) = 0;
                  uVar9 = uVar3;
                }
                __archive_read_consume(a,lVar18);
                lVar18 = lVar18 + *(long *)((long)pvVar5 + 0x40);
                *(long *)((long)pvVar5 + 0x40) = lVar18;
                lVar24 = (ulong)*(uint *)((long)pvVar5 + 0x4c) - lVar18;
                if (lVar24 < 0) {
                  archive_set_error(&a->archive,-1,"Invalid offset of CFFILE %jd < %jd",
                                    (ulong)*(uint *)((long)pvVar5 + 0x4c),lVar18);
                  return L'\xffffffe2';
                }
                if (lVar24 != 0) {
                  __archive_read_consume(a,lVar24);
                  *(long *)((long)pvVar5 + 0x40) = *(long *)((long)pvVar5 + 0x40) + lVar24;
                }
                uVar17 = *(ushort *)((long)pvVar5 + 0x52);
                pvVar12 = calloc((ulong)uVar17,0x30);
                *(void **)((long)pvVar5 + 0x68) = pvVar12;
                if (pvVar12 != (void *)0x0) {
                  uVar3 = 0xffffffff;
                  for (uVar28 = 0; uVar28 < uVar17; uVar28 = uVar28 + 1) {
                    puVar27 = (uint *)(uVar28 * 0x30 + *(long *)((long)pvVar5 + 0x68));
                    puVar14 = (uint *)__archive_read_ahead(a,0x10,(ssize_t *)0x0);
                    if (puVar14 == (uint *)0x0) goto LAB_0014adea;
                    *puVar27 = *puVar14;
                    puVar27[1] = puVar14[1];
                    *(short *)(puVar27 + 4) = (short)puVar14[2];
                    uVar17 = *(ushort *)((long)puVar14 + 10);
                    uVar25 = (ushort)puVar14[3];
                    local_68.tm_gmtoff = 0;
                    local_68.tm_zone = (char *)0x0;
                    local_68.tm_wday = 0;
                    local_68.tm_yday = 0;
                    local_68.tm_year = (uVar17 >> 9) + 0x50;
                    local_68.tm_mon = (uVar17 >> 5 & 0xf) - 1;
                    local_68.tm_mday = uVar17 & 0x1f;
                    local_68.tm_hour = (int)(uVar25 >> 0xb);
                    local_68.tm_min = uVar25 >> 5 & 0x3f;
                    local_68.tm_sec = (uint)uVar25 * 2 & 0x3e;
                    local_68.tm_isdst = -1;
                    local_68._36_4_ = 0;
                    tVar15 = mktime(&local_68);
                    *(time_t *)(puVar27 + 2) = tVar15;
                    *(undefined1 *)((long)puVar27 + 0x12) = *(undefined1 *)((long)puVar14 + 0xe);
                    __archive_read_consume(a,0x10);
                    *(long *)((long)pvVar5 + 0x40) = *(long *)((long)pvVar5 + 0x40) + 0x10;
                    sVar16 = 0x100;
                    do {
                      if (sVar16 == 0) goto LAB_0014adea;
                      p_00 = (uchar *)__archive_read_ahead(a,sVar16,&local_70);
                      sVar16 = sVar16 - 1;
                    } while (p_00 == (uchar *)0x0);
                    sVar16 = cab_strnlen(p_00,local_70 - 1);
                    if ((long)sVar16 < 1) goto LAB_0014b0aa;
                    puVar27[6] = 0;
                    puVar27[7] = 0;
                    puVar27[8] = 0;
                    puVar27[9] = 0;
                    puVar27[10] = 0;
                    puVar27[0xb] = 0;
                    archive_strncat((archive_string *)(puVar27 + 6),p_00,sVar16);
                    __archive_read_consume(a,sVar16 + 1);
                    *(long *)((long)pvVar5 + 0x40) = *(long *)((long)pvVar5 + 0x40) + sVar16 + 1;
                    uVar19 = (ulong)*puVar27;
                    if ((0x7fff8000 < uVar19) || (uVar26 = puVar27[1], 0x7fff8000 < uVar26 + uVar19)
                       ) goto LAB_0014b0aa;
                    uVar17 = (ushort)puVar27[4];
                    uVar21 = (uint)uVar17;
                    if (uVar17 == 0xfffd) {
                      if (uVar28 != 0) goto LAB_0014b0aa;
LAB_0014b041:
                      uVar3 = 0;
                      uVar21 = 0;
                      uVar9 = uVar26;
                    }
                    else {
                      if (uVar17 == 0xffff) {
                        if ((uVar28 == 0) && (*(short *)((long)pvVar5 + 0x52) == 1))
                        goto LAB_0014b041;
                        goto LAB_0014b0aa;
                      }
                      if (uVar17 == 0xfffe) {
                        if (uVar28 != *(ushort *)((long)pvVar5 + 0x52) - 1) goto LAB_0014b0aa;
                        uVar21 = *(ushort *)((long)pvVar5 + 0x50) - 1;
                      }
                      else if (*(ushort *)((long)pvVar5 + 0x50) <= uVar17) goto LAB_0014b0aa;
                      if ((int)uVar21 < (int)uVar3) goto LAB_0014b0aa;
                    }
                    if (uVar21 != uVar3) {
                      uVar9 = 0;
                    }
                    if ((uVar9 != uVar26) ||
                       ((uVar19 != 0 &&
                        (*(short *)(*(long *)((long)pvVar5 + 0x60) + 4 + (long)(int)uVar21 * 0x60)
                         == 0)))) goto LAB_0014b0aa;
                    uVar9 = uVar26 + *puVar27;
                    uVar17 = *(ushort *)((long)pvVar5 + 0x52);
                    uVar3 = uVar21;
                  }
                  if ((*(short *)((long)pvVar5 + 0x58) == 0) &&
                     ((*(byte *)((long)pvVar5 + 0x54) & 3) == 0)) {
                    wVar7 = L'\0';
                  }
                  else {
                    archive_set_error(&a->archive,0x54,"Multivolume cabinet file is unsupported");
                    wVar7 = L'\xffffffec';
                  }
                  *(undefined1 *)(puVar4 + 0x12) = 1;
                  goto LAB_0014a71b;
                }
              }
              pcVar22 = "Can\'t allocate memory for CAB data";
              iVar23 = 0xc;
              goto LAB_0014ab6f;
            }
            pvVar12 = __archive_read_ahead(a,lVar24 + 0x100,(ssize_t *)0x0);
            if (pvVar12 == (void *)0x0) goto LAB_0014adea;
            sVar13 = cab_strnlen((uchar *)((long)pvVar12 + lVar24),0xff);
            if (0 < sVar13) {
              pvVar12 = __archive_read_ahead(a,sVar13 + lVar24 + 0x101,(ssize_t *)0x0);
              if (pvVar12 == (void *)0x0) goto LAB_0014adea;
              lVar24 = sVar13 + lVar24 + 1;
              sVar13 = cab_strnlen((uchar *)((long)pvVar12 + lVar24),0xff);
              if (0 < sVar13) {
                lVar24 = lVar24 + sVar13 + 1;
                goto LAB_0014abb3;
              }
            }
          }
          else {
            pvVar12 = __archive_read_ahead(a,lVar24 + 0x100,(ssize_t *)0x0);
            if (pvVar12 == (void *)0x0) goto LAB_0014adea;
            sVar13 = cab_strnlen((uchar *)((long)pvVar12 + lVar24),0xff);
            if (0 < sVar13) {
              pvVar12 = __archive_read_ahead(a,sVar13 + lVar24 + 0x101,(ssize_t *)0x0);
              if (pvVar12 == (void *)0x0) goto LAB_0014adea;
              lVar24 = sVar13 + lVar24 + 1;
              sVar13 = cab_strnlen((uchar *)((long)pvVar12 + lVar24),0xff);
              if (0 < sVar13) {
                lVar24 = lVar24 + sVar13 + 1;
                uVar17 = *(ushort *)((long)pvVar5 + 0x54);
                goto LAB_0014aba7;
              }
            }
          }
        }
LAB_0014b0aa:
        pcVar22 = "Invalid CAB header";
        iVar23 = 0x54;
        goto LAB_0014ab6f;
      }
    }
    pcVar22 = "Couldn\'t find out CAB header";
    iVar23 = 0x54;
    goto LAB_0014ab6f;
  }
LAB_0014a71b:
  iVar23 = *(int *)(puVar4 + 0xe);
  if ((int)(uint)*(ushort *)((long)puVar4 + 0x52) <= iVar23) {
    *(undefined1 *)((long)puVar4 + 0x91) = 1;
    return L'\x01';
  }
  lVar24 = puVar4[5];
  *(int *)(puVar4 + 0xe) = iVar23 + 1;
  puVar14 = (uint *)(puVar4[0xd] + (long)iVar23 * 0x30);
  *(undefined2 *)((long)puVar4 + 0x92) = 0;
  puVar4[4] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[6] = puVar14;
  uVar17 = *(ushort *)(puVar4[0xd] + 0x10 + (long)iVar23 * 0x30);
  if (uVar17 == 0xffff) {
LAB_0014a77e:
    lVar18 = puVar4[0xc];
  }
  else if (uVar17 == 0xfffe) {
    lVar18 = puVar4[0xc] + (ulong)*(ushort *)(puVar4 + 10) * 0x60 + -0x60;
  }
  else {
    if (uVar17 == 0xfffd) goto LAB_0014a77e;
    lVar18 = (ulong)uVar17 * 0x60 + puVar4[0xc];
  }
  puVar4[5] = lVar18;
  if (lVar24 != lVar18) {
    puVar4[7] = 0;
  }
  if (*(char *)((long)puVar14 + 0x12) < '\0') {
    sc = (archive_string_conv *)puVar4[0x19];
    if (sc == (archive_string_conv *)0x0) {
      sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      puVar4[0x19] = sc;
      if (sc == (archive_string_conv *)0x0) {
        return L'\xffffffe2';
      }
    }
  }
  else {
    sc = (archive_string_conv *)puVar4[0x17];
    if (sc == (archive_string_conv *)0x0) {
      if (*(int *)(puVar4 + 0x16) == 0) {
        sc = archive_string_default_conversion_for_read(&a->archive);
        puVar4[0x18] = sc;
        *(undefined4 *)(puVar4 + 0x16) = 1;
      }
      else {
        sc = (archive_string_conv *)puVar4[0x18];
      }
    }
  }
  cVar1 = *(char *)((long)puVar14 + 0x12);
  uVar28 = 0;
  bVar20 = false;
  while( true ) {
    pcVar22 = *(char **)(puVar14 + 6);
    uVar19 = *(ulong *)(puVar14 + 8);
    if (uVar19 <= uVar28) break;
    if (pcVar22[uVar28] == '\\') {
      if (bVar20) break;
      pcVar22[uVar28] = '/';
      bVar20 = false;
    }
    else {
      bVar20 = pcVar22[uVar28] < '\0' && -1 < cVar1;
    }
    uVar28 = uVar28 + 1;
  }
  wVar8 = _archive_entry_copy_pathname_l(entry,pcVar22,uVar19,sc);
  if (wVar8 != L'\0') {
    piVar10 = __errno_location();
    if (*piVar10 == 0xc) {
      pcVar22 = "Can\'t allocate memory for Pathname";
      iVar23 = 0xc;
LAB_0014ab6f:
      archive_set_error(&a->archive,iVar23,pcVar22);
      return L'\xffffffe2';
    }
    archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.");
    wVar7 = L'\xffffffec';
  }
  if ((uVar28 != uVar19) && (pwVar11 = archive_entry_pathname_w(entry), pwVar11 != (wchar_t *)0x0))
  {
    puVar4[0x10] = 0;
    n = wcslen(pwVar11);
    archive_wstrncat((archive_wstring *)(puVar4 + 0xf),pwVar11,n);
    pwVar11 = (wchar_t *)puVar4[0xf];
    lVar24 = puVar4[0x10];
    for (lVar18 = 0; lVar24 != lVar18; lVar18 = lVar18 + 1) {
      if (pwVar11[lVar18] == L'\\') {
        pwVar11[lVar18] = L'/';
      }
    }
    archive_entry_copy_pathname_w(entry,pwVar11);
  }
  archive_entry_set_size(entry,(ulong)*puVar14);
  m = 0x816d;
  if ((*(byte *)((long)puVar14 + 0x12) & 1) == 0) {
    m = 0x81b6;
  }
  archive_entry_set_mode(entry,m);
  archive_entry_set_mtime(entry,*(time_t *)(puVar14 + 2),0);
  uVar9 = *puVar14;
  *puVar4 = 0;
  puVar4[1] = (ulong)uVar9;
  if ((ulong)uVar9 == 0) {
    *(undefined2 *)((long)puVar4 + 0x92) = 0x101;
  }
  sprintf((char *)(puVar4 + 0x1a),"CAB %d.%d (%s)",(ulong)*(byte *)((long)puVar4 + 0x5a),
          (ulong)*(byte *)((long)puVar4 + 0x5b),*(undefined8 *)(puVar4[5] + 0x10));
  (a->archive).archive_format_name = (char *)(puVar4 + 0x1a);
  return wVar7;
}

Assistant:

static int
cab_read_header(struct archive_read *a)
{
	const unsigned char *p;
	struct cab *cab;
	struct cfheader *hd;
	size_t bytes, used;
	ssize_t len;
	int64_t skip;
	int err, i;
	int cur_folder, prev_folder;
	uint32_t offset32;
	
	a->archive.archive_format = ARCHIVE_FORMAT_CAB;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "CAB";

	if ((p = __archive_read_ahead(a, 42, NULL)) == NULL)
		return (truncated_error(a));

	cab = (struct cab *)(a->format->data);
	if (cab->found_header == 0 &&
	    p[0] == 'M' && p[1] == 'Z') {
		/* This is an executable?  Must be self-extracting... 	*/
		err = cab_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
	}

	cab->cab_offset = 0;
	/*
	 * Read CFHEADER.
	 */
	hd = &cab->cfheader;
	if (p[CFHEADER_signature+0] != 'M' || p[CFHEADER_signature+1] != 'S' ||
	    p[CFHEADER_signature+2] != 'C' || p[CFHEADER_signature+3] != 'F') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Couldn't find out CAB header");
		return (ARCHIVE_FATAL);
	}
	hd->total_bytes = archive_le32dec(p + CFHEADER_cbCabinet);
	hd->files_offset = archive_le32dec(p + CFHEADER_coffFiles);
	hd->minor = p[CFHEADER_versionMinor];
	hd->major = p[CFHEADER_versionMajor];
	hd->folder_count = archive_le16dec(p + CFHEADER_cFolders);
	if (hd->folder_count == 0)
		goto invalid;
	hd->file_count = archive_le16dec(p + CFHEADER_cFiles);
	if (hd->file_count == 0)
		goto invalid;
	hd->flags = archive_le16dec(p + CFHEADER_flags);
	hd->setid = archive_le16dec(p + CFHEADER_setID);
	hd->cabinet = archive_le16dec(p + CFHEADER_iCabinet);
	used = CFHEADER_iCabinet + 2;
	if (hd->flags & RESERVE_PRESENT) {
		uint16_t cfheader;
		cfheader = archive_le16dec(p + CFHEADER_cbCFHeader);
		if (cfheader > 60000U)
			goto invalid;
		hd->cffolder = p[CFHEADER_cbCFFolder];
		hd->cfdata = p[CFHEADER_cbCFData];
		used += 4;/* cbCFHeader, cbCFFolder and cbCFData */
		used += cfheader;/* abReserve */
	} else
		hd->cffolder = 0;/* Avoid compiling warning. */
	if (hd->flags & PREV_CABINET) {
		/* How many bytes are used for szCabinetPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskPrev. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	if (hd->flags & NEXT_CABINET) {
		/* How many bytes are used for szCabinetNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
		/* How many bytes are used for szDiskNext. */
		if ((p = __archive_read_ahead(a, used+256, NULL)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p + used, 255)) <= 0)
			goto invalid;
		used += len + 1;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;
	used = 0;

	/*
	 * Read CFFOLDER.
	 */
	hd->folder_array = (struct cffolder *)calloc(
	    hd->folder_count, sizeof(struct cffolder));
	if (hd->folder_array == NULL)
		goto nomem;
	
	bytes = 8;
	if (hd->flags & RESERVE_PRESENT)
		bytes += hd->cffolder;
	bytes *= hd->folder_count;
	if ((p = __archive_read_ahead(a, bytes, NULL)) == NULL)
		return (truncated_error(a));
	offset32 = 0;
	for (i = 0; i < hd->folder_count; i++) {
		struct cffolder *folder = &(hd->folder_array[i]);
		folder->cfdata_offset_in_cab =
		    archive_le32dec(p + CFFOLDER_coffCabStart);
		folder->cfdata_count = archive_le16dec(p+CFFOLDER_cCFData);
		folder->comptype =
		    archive_le16dec(p+CFFOLDER_typeCompress) & 0x0F;
		folder->compdata =
		    archive_le16dec(p+CFFOLDER_typeCompress) >> 8;
		/* Get a compression name. */
		if (folder->comptype <
		    sizeof(compression_name) / sizeof(compression_name[0]))
			folder->compname = compression_name[folder->comptype];
		else
			folder->compname = "UNKNOWN";
		p += 8;
		used += 8;
		if (hd->flags & RESERVE_PRESENT) {
			p += hd->cffolder;/* abReserve */
			used += hd->cffolder;
		}
		/*
		 * Sanity check if each data is acceptable.
		 */
		if (offset32 >= folder->cfdata_offset_in_cab)
			goto invalid;
		offset32 = folder->cfdata_offset_in_cab;

		/* Set a request to initialize zlib for the CFDATA of
		 * this folder. */
		folder->decompress_init = 0;
	}
	__archive_read_consume(a, used);
	cab->cab_offset += used;

	/*
	 * Read CFFILE.
	 */
	/* Seek read pointer to the offset of CFFILE if needed. */
	skip = (int64_t)hd->files_offset - cab->cab_offset;
	if (skip <  0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid offset of CFFILE %jd < %jd",
		    (intmax_t)hd->files_offset, (intmax_t)cab->cab_offset);
		return (ARCHIVE_FATAL);
	}
	if (skip) {
		__archive_read_consume(a, skip);
		cab->cab_offset += skip;
	}
	/* Allocate memory for CFDATA */
	hd->file_array = (struct cffile *)calloc(
	    hd->file_count, sizeof(struct cffile));
	if (hd->file_array == NULL)
		goto nomem;

	prev_folder = -1;
	for (i = 0; i < hd->file_count; i++) {
		struct cffile *file = &(hd->file_array[i]);
		ssize_t avail;

		if ((p = __archive_read_ahead(a, 16, NULL)) == NULL)
			return (truncated_error(a));
		file->uncompressed_size = archive_le32dec(p + CFFILE_cbFile);
		file->offset = archive_le32dec(p + CFFILE_uoffFolderStart);
		file->folder = archive_le16dec(p + CFFILE_iFolder);
		file->mtime = cab_dos_time(p + CFFILE_date_time);
		file->attr = (uint8_t)archive_le16dec(p + CFFILE_attribs);
		__archive_read_consume(a, 16);

		cab->cab_offset += 16;
		if ((p = cab_read_ahead_remaining(a, 256, &avail)) == NULL)
			return (truncated_error(a));
		if ((len = cab_strnlen(p, avail-1)) <= 0)
			goto invalid;

		/* Copy a pathname.  */
		archive_string_init(&(file->pathname));
		archive_strncpy(&(file->pathname), p, len);
		__archive_read_consume(a, len + 1);
		cab->cab_offset += len + 1;

		/*
		 * Sanity check if each data is acceptable.
		 */
		if (file->uncompressed_size > 0x7FFF8000)
			goto invalid;/* Too large */
		if ((int64_t)file->offset + (int64_t)file->uncompressed_size
		    > ARCHIVE_LITERAL_LL(0x7FFF8000))
			goto invalid;/* Too large */
		switch (file->folder) {
		case iFoldCONTINUED_TO_NEXT:
			/* This must be last file in a folder. */
			if (i != hd->file_count -1)
				goto invalid;
			cur_folder = hd->folder_count -1;
			break;
		case iFoldCONTINUED_PREV_AND_NEXT:
			/* This must be only one file in a folder. */
			if (hd->file_count != 1)
				goto invalid;
			/* FALL THROUGH */
		case iFoldCONTINUED_FROM_PREV:
			/* This must be first file in a folder. */
			if (i != 0)
				goto invalid;
			prev_folder = cur_folder = 0;
			offset32 = file->offset;
			break;
		default:
			if (file->folder >= hd->folder_count)
				goto invalid;
			cur_folder = file->folder;
			break;
		}
		/* Dot not back track. */
		if (cur_folder < prev_folder)
			goto invalid;
		if (cur_folder != prev_folder)
			offset32 = 0;
		prev_folder = cur_folder;

		/* Make sure there are not any blanks from last file
		 * contents. */
		if (offset32 != file->offset)
			goto invalid;
		offset32 += file->uncompressed_size;

		/* CFDATA is available for file contents. */
		if (file->uncompressed_size > 0 &&
		    hd->folder_array[cur_folder].cfdata_count == 0)
			goto invalid;
	}

	if (hd->cabinet != 0 || hd->flags & (PREV_CABINET | NEXT_CABINET)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Multivolume cabinet file is unsupported");
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CAB header");
	return (ARCHIVE_FATAL);
nomem:
	archive_set_error(&a->archive, ENOMEM,
	    "Can't allocate memory for CAB data");
	return (ARCHIVE_FATAL);
}